

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O3

WitnessVersion __thiscall cfd::core::Script::GetWitnessVersion(Script *this)

{
  ScriptType SVar1;
  bool bVar2;
  
  bVar2 = IsWitnessProgram(this);
  if (bVar2) {
    SVar1 = (((this->script_stack_).
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_start)->op_code_).data_type_;
    if (SVar1 == kOpFalse) {
      return kVersion0;
    }
    if (0xffffffef < SVar1 - kOpNop) {
      return SVar1 - kOpReserved;
    }
  }
  return kVersionNone;
}

Assistant:

WitnessVersion Script::GetWitnessVersion() const {
  if (IsWitnessProgram()) {
    auto val = script_stack_[0].GetOpCode().GetDataType();
    if (kOp_0 == val) {
      return WitnessVersion::kVersion0;
    } else if ((kOp_1 <= val) && (val <= kOp_16)) {
      auto num = val - kOp_1;
      auto version = WitnessVersion::kVersion1 + num;
      return static_cast<WitnessVersion>(version);
    }
  }
  return WitnessVersion::kVersionNone;
}